

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O1

bool __thiscall cmGetPropertyCommand::HandleTargetMode(cmGetPropertyCommand *this)

{
  string *prop;
  bool bVar1;
  int iVar2;
  cmTarget *this_00;
  cmMessenger *messenger;
  char *value;
  ostream *poVar3;
  pointer value_00;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [16];
  undefined1 local_188 [360];
  
  if ((this->Name)._M_string_length == 0) {
    local_198._0_8_ = (cmState *)(local_198 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"not given name for TARGET scope.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
    if ((cmState *)local_198._0_8_ != (cmState *)(local_198 + 0x10)) {
      operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
    }
  }
  else {
    this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,&this->Name,false);
    if (this_00 != (cmTarget *)0x0) {
      prop = &this->PropertyName;
      iVar2 = std::__cxx11::string::compare((char *)prop);
      if (iVar2 == 0) {
        bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,&this->Name);
        if (bVar1) {
          value_00 = (this_00->Name)._M_dataplus._M_p;
        }
        else {
          value_00 = (char *)0x0;
        }
        StoreResult(this,value_00);
      }
      else {
        cmMakefile::GetBacktrace((cmListFileBacktrace *)local_198,(this->super_cmCommand).Makefile);
        messenger = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
        bVar1 = cmTargetPropertyComputer::PassesWhitelist
                          (this_00->TargetTypeValue,prop,messenger,(cmListFileBacktrace *)local_198)
        ;
        if (bVar1) {
          value = cmTarget::GetComputedProperty
                            (this_00,prop,messenger,(cmListFileBacktrace *)local_198);
          if (value == (char *)0x0) {
            value = cmTarget::GetProperty(this_00,prop);
          }
        }
        else {
          value = (char *)0x0;
        }
        StoreResult(this,value);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_198);
      }
      if (this_00 != (cmTarget *)0x0) {
        return true;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"could not find TARGET ",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(this->Name)._M_dataplus._M_p,
                        (this->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,".  Perhaps it has not yet been created.",0x27);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_188 + 0x60));
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::HandleTargetMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for TARGET scope.");
    return false;
  }

  if (cmTarget* target = this->Makefile->FindTargetToUse(this->Name)) {
    if (this->PropertyName == "ALIASED_TARGET") {
      if (this->Makefile->IsAlias(this->Name)) {
        return this->StoreResult(target->GetName().c_str());
      }
      return this->StoreResult(CM_NULLPTR);
    }
    const char* prop_cstr = CM_NULLPTR;
    cmListFileBacktrace bt = this->Makefile->GetBacktrace();
    cmMessenger* messenger = this->Makefile->GetMessenger();
    if (cmTargetPropertyComputer::PassesWhitelist(
          target->GetType(), this->PropertyName, messenger, bt)) {
      prop_cstr =
        target->GetComputedProperty(this->PropertyName, messenger, bt);
      if (!prop_cstr) {
        prop_cstr = target->GetProperty(this->PropertyName);
      }
    }
    return this->StoreResult(prop_cstr);
  }
  std::ostringstream e;
  e << "could not find TARGET " << this->Name
    << ".  Perhaps it has not yet been created.";
  this->SetError(e.str());
  return false;
}